

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O0

void __thiscall CConnman::Init(CConnman *this,Options *connOptions)

{
  long lVar1;
  bool bVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  string *added_node;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool use_v2transport;
  const_iterator __end2;
  const_iterator __begin2;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock8;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff5b;
  int in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_type local_68;
  vector<CService,_std::allocator<CService>_> *in_stack_ffffffffffffffd0;
  vector<CService,_std::allocator<CService>_> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  AssertLockNotHeldInline
            ((char *)in_RDI,(char *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
             (Mutex *)0x23c948);
  std::atomic<ServiceFlags>::operator=
            ((atomic<ServiceFlags> *)in_RDI,(ServiceFlags)in_stack_ffffffffffffff40);
  *(undefined4 *)&in_RDI[0x12]._M_dataplus._M_p = *(undefined4 *)&in_RSI->_M_string_length;
  piVar3 = std::min<int>((int *)in_stack_ffffffffffffff40,
                         (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  *(int *)((long)&in_RDI[0x12]._M_dataplus._M_p + 4) = *piVar3;
  piVar3 = std::min<int>((int *)in_stack_ffffffffffffff40,
                         (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  *(int *)&in_RDI[0x12]._M_string_length = *piVar3;
  *(int *)((long)&in_RDI[0x12].field_2 + 4) =
       *(undefined4 *)((long)&in_RDI[0x12]._M_dataplus._M_p + 4) +
       (int)in_RDI[0x12]._M_string_length + *(int *)&in_RDI[0x12].field_2;
  piVar3 = std::max<int>((int *)in_stack_ffffffffffffff40,
                         (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  *(int *)((long)&in_RDI[0x12].field_2 + 8) = *piVar3;
  in_RDI[0x12].field_2._M_local_buf[0xc] = in_RSI[6].field_2._M_local_buf[1] & 1;
  in_RDI[0x13]._M_dataplus._M_p = (pointer)(in_RSI->field_2)._M_allocated_capacity;
  in_RDI[0x13].field_2._M_allocated_capacity =
       (size_type)((unique_lock *)&in_RSI[1]._M_dataplus)->_M_device;
  in_RDI[0x13]._M_string_length = *(size_type *)((long)&in_RSI->field_2 + 8);
  *(undefined4 *)&in_RDI[4]._M_string_length = *(undefined4 *)&in_RSI[1]._M_string_length;
  *(undefined4 *)((long)&in_RDI[4]._M_string_length + 4) =
       *(undefined4 *)((long)&in_RSI[1]._M_string_length + 4);
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
            ((duration<long,_std::ratio<1L,_1L>_> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),(long *)0x23ca84);
  in_RDI[2].field_2._M_allocated_capacity = local_68;
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_RSI,
             (AnnotatedMixin<std::mutex> *)
             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
             ,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(bool)in_stack_ffffffffffffff5b);
  in_RDI[2]._M_string_length = in_RSI[1].field_2._M_allocated_capacity;
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::operator=
            ((vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
             in_stack_ffffffffffffffd8,
             (vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
             in_stack_ffffffffffffffd0);
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::operator=
            ((vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
             in_stack_ffffffffffffffd8,
             (vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
             in_stack_ffffffffffffffd0);
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_RSI,
             (AnnotatedMixin<std::mutex> *)
             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
             ,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(bool)in_stack_ffffffffffffff5b);
  GetLocalServices((CConnman *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin(in_stack_ffffffffffffff40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end(in_stack_ffffffffffffff40);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffff40);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    in_stack_ffffffffffffff40 =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)((long)&in_RDI[9].field_2 + 8);
    std::__cxx11::string::string(this_00,in_RSI);
    std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::push_back
              ((vector<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),(value_type *)0x23cbfa)
    ;
    AddedNodeParams::~AddedNodeParams
              ((AddedNodeParams *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  std::vector<CService,_std::allocator<CService>_>::operator=
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  *(byte *)&in_RDI[0x1e]._M_dataplus._M_p = *(byte *)((long)&in_RSI[8]._M_string_length + 1) & 1;
  *(byte *)((long)&in_RDI[0x1e]._M_dataplus._M_p + 1) =
       *(byte *)((long)&in_RSI[8]._M_string_length + 2) & 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_added_nodes_mutex, !m_total_bytes_sent_mutex)
    {
        AssertLockNotHeld(m_total_bytes_sent_mutex);

        nLocalServices = connOptions.nLocalServices;
        m_max_automatic_connections = connOptions.m_max_automatic_connections;
        m_max_outbound_full_relay = std::min(MAX_OUTBOUND_FULL_RELAY_CONNECTIONS, m_max_automatic_connections);
        m_max_outbound_block_relay = std::min(MAX_BLOCK_RELAY_ONLY_CONNECTIONS, m_max_automatic_connections - m_max_outbound_full_relay);
        m_max_automatic_outbound = m_max_outbound_full_relay + m_max_outbound_block_relay + m_max_feeler;
        m_max_inbound = std::max(0, m_max_automatic_connections - m_max_automatic_outbound);
        m_use_addrman_outgoing = connOptions.m_use_addrman_outgoing;
        m_client_interface = connOptions.uiInterface;
        m_banman = connOptions.m_banman;
        m_msgproc = connOptions.m_msgproc;
        nSendBufferMaxSize = connOptions.nSendBufferMaxSize;
        nReceiveFloodSize = connOptions.nReceiveFloodSize;
        m_peer_connect_timeout = std::chrono::seconds{connOptions.m_peer_connect_timeout};
        {
            LOCK(m_total_bytes_sent_mutex);
            nMaxOutboundLimit = connOptions.nMaxOutboundLimit;
        }
        vWhitelistedRangeIncoming = connOptions.vWhitelistedRangeIncoming;
        vWhitelistedRangeOutgoing = connOptions.vWhitelistedRangeOutgoing;
        {
            LOCK(m_added_nodes_mutex);
            // Attempt v2 connection if we support v2 - we'll reconnect with v1 if our
            // peer doesn't support it or immediately disconnects us for another reason.
            const bool use_v2transport(GetLocalServices() & NODE_P2P_V2);
            for (const std::string& added_node : connOptions.m_added_nodes) {
                m_added_node_params.push_back({added_node, use_v2transport});
            }
        }
        m_onion_binds = connOptions.onion_binds;
        whitelist_forcerelay = connOptions.whitelist_forcerelay;
        whitelist_relay = connOptions.whitelist_relay;
    }